

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Command::raiseError(Command *this,string *message)

{
  ulong uVar1;
  ostream *poVar2;
  size_type sVar3;
  const_reference pvVar4;
  domain_error *this_00;
  string local_1c8 [32];
  ulong local_1a8;
  size_t i;
  ostringstream local_190 [8];
  ostringstream oss;
  string *message_local;
  Command *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)local_190,"Error while parsing arguments. ");
    poVar2 = std::operator<<(poVar2,(string *)message);
    std::operator<<(poVar2,".");
  }
  else {
    poVar2 = std::operator<<((ostream *)local_190,"Error while parsing ");
    poVar2 = std::operator<<(poVar2,(string *)this);
    poVar2 = std::operator<<(poVar2,". ");
    poVar2 = std::operator<<(poVar2,(string *)message);
    std::operator<<(poVar2,".");
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_args);
  if (sVar3 != 0) {
    std::operator<<((ostream *)local_190," Arguments were:");
  }
  local_1a8 = 0;
  while( true ) {
    uVar1 = local_1a8;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->m_args);
    if (sVar3 <= uVar1) break;
    poVar2 = std::operator<<((ostream *)local_190," ");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_args,local_1a8);
    std::operator<<(poVar2,(string *)pvVar4);
    local_1a8 = local_1a8 + 1;
  }
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::domain_error::domain_error(this_00,local_1c8);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

CATCH_ATTRIBUTE_NORETURN
        void raiseError( const std::string& message ) const {
            std::ostringstream oss;
            if( m_name.empty() )
                oss << "Error while parsing " << m_name << ". " << message << ".";
            else
                oss << "Error while parsing arguments. " << message << ".";

            if( m_args.size() > 0 )
                oss << " Arguments were:";
            for( std::size_t i = 0; i < m_args.size(); ++i )
                oss << " " << m_args[i];
            throw std::domain_error( oss.str() );
        }